

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void expr(Vm *vm)

{
  Compiler *pCVar1;
  Token *pTVar2;
  uint32_t *puVar3;
  TokenType TVar4;
  char *pcVar5;
  size_t sVar6;
  Token identifier;
  VarHTItemKey key;
  undefined4 uVar7;
  undefined4 uVar8;
  uint uVar9;
  uint32_t uVar10;
  CallFrame *frame;
  ObjLambda *object;
  uint8_t uVar11;
  CrispyValue value;
  Variable value_00;
  CrispyValue CVar12;
  Token param;
  Token local_60;
  CallFrame *local_40;
  Scanner *local_38;
  
  TVar4 = (vm->compiler).token.type;
  if ((int)TVar4 < 0x18) {
    if (TVar4 == TOKEN_IDENTIFIER) {
      assignment(vm);
      return;
    }
    if (TVar4 == TOKEN_OPEN_BRACE) {
      block_expr(vm);
      return;
    }
  }
  else {
    if (TVar4 == TOKEN_IF) {
      if_expr(vm);
      return;
    }
    if (TVar4 == TOKEN_FUN) {
      pCVar1 = &vm->compiler;
      TVar4 = (pCVar1->token).type;
      uVar8 = *(undefined4 *)&(pCVar1->token).field_0x4;
      pcVar5 = (vm->compiler).token.start;
      uVar10 = (vm->compiler).token.line;
      uVar7 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
      (vm->compiler).previous.length = (vm->compiler).token.length;
      (vm->compiler).previous.line = uVar10;
      *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar7;
      (vm->compiler).previous.type = TVar4;
      *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar8;
      (vm->compiler).previous.start = pcVar5;
      uVar7 = *(undefined4 *)&(vm->compiler).next.field_0x4;
      pcVar5 = (vm->compiler).next.start;
      sVar6 = (vm->compiler).next.length;
      uVar10 = (vm->compiler).next.line;
      uVar8 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
      (pCVar1->token).type = (vm->compiler).next.type;
      *(undefined4 *)&(pCVar1->token).field_0x4 = uVar7;
      (vm->compiler).token.start = pcVar5;
      (vm->compiler).token.length = sVar6;
      (vm->compiler).token.line = uVar10;
      *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar8;
      local_38 = &(vm->compiler).scanner;
      scan_token(&local_60,local_38);
      (vm->compiler).next.length = local_60.length;
      (vm->compiler).next.line = local_60.line;
      *(undefined4 *)&(vm->compiler).next.field_0x1c = local_60._28_4_;
      (vm->compiler).next.type = local_60.type;
      *(undefined4 *)&(vm->compiler).next.field_0x4 = local_60._4_4_;
      (vm->compiler).next.start = local_60.start;
      uVar9 = (vm->compiler).scope_depth + 1;
      (vm->compiler).scope_depth = uVar9;
      var_ht_init((vm->compiler).scope + uVar9,8);
      uVar11 = '\0';
      frame = new_call_frame();
      uVar10 = vm->frame_count;
      vm->frame_count = uVar10 + 1;
      frames_write_at(&vm->frames,uVar10,frame);
      if ((vm->compiler).token.type != TOKEN_ARROW) {
        pTVar2 = &(vm->compiler).next;
        uVar11 = '\x01';
        local_40 = frame;
        while( true ) {
          consume(&local_60,vm,TOKEN_IDENTIFIER,"Expected parameter name");
          key.ident_length = local_60.length;
          key.key_ident_string = local_60.start;
          uVar10 = (vm->compiler).vars_in_scope;
          (vm->compiler).vars_in_scope = uVar10 + 1;
          uVar9 = (vm->compiler).scope_depth;
          value_00.scope = uVar9;
          value_00.index = uVar10;
          value_00._8_8_ = (ulong)vm->frame_count | 0x100000000;
          var_ht_put((vm->compiler).scope + uVar9,key,value_00);
          identifier.start = local_60.start;
          identifier.type = local_60.type;
          identifier._4_4_ = local_60._4_4_;
          identifier.length = local_60.length;
          identifier.line = local_60.line;
          identifier._28_4_ = local_60._28_4_;
          define_var(vm,identifier);
          frame = local_40;
          if ((vm->compiler).token.type != TOKEN_COMMA) break;
          TVar4 = (pCVar1->token).type;
          uVar8 = *(undefined4 *)&(pCVar1->token).field_0x4;
          pcVar5 = (vm->compiler).token.start;
          uVar10 = (vm->compiler).token.line;
          uVar7 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
          (vm->compiler).previous.length = (vm->compiler).token.length;
          (vm->compiler).previous.line = uVar10;
          *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar7;
          (vm->compiler).previous.type = TVar4;
          *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar8;
          (vm->compiler).previous.start = pcVar5;
          uVar7 = *(undefined4 *)&pTVar2->field_0x4;
          pcVar5 = (vm->compiler).next.start;
          sVar6 = (vm->compiler).next.length;
          uVar10 = (vm->compiler).next.line;
          uVar8 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
          (pCVar1->token).type = pTVar2->type;
          *(undefined4 *)&(pCVar1->token).field_0x4 = uVar7;
          (vm->compiler).token.start = pcVar5;
          (vm->compiler).token.length = sVar6;
          (vm->compiler).token.line = uVar10;
          *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar8;
          scan_token(&local_60,local_38);
          (vm->compiler).next.length = local_60.length;
          (vm->compiler).next.line = local_60.line;
          *(undefined4 *)&(vm->compiler).next.field_0x1c = local_60._28_4_;
          pTVar2->type = local_60.type;
          *(undefined4 *)&pTVar2->field_0x4 = local_60._4_4_;
          (vm->compiler).next.start = local_60.start;
          uVar11 = uVar11 + '\x01';
        }
      }
      consume(&local_60,vm,TOKEN_ARROW,"Expected \'->\' after parameter list");
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\x1b');
      expr(vm);
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'1');
      vm->frame_count = vm->frame_count - 1;
      object = new_lambda(vm,uVar11);
      object->call_frame = frame;
      frame->ip = (frame->code_buffer).code;
      CVar12 = create_object(&object->object);
      value.field_1 = CVar12.field_1;
      value._4_4_ = 0;
      value.type = CVar12.type;
      uVar10 = add_constant(vm,value);
      if ((uVar10 & 0xff00) == 0) {
        uVar11 = '\x12';
      }
      else {
        uVar11 = (uint8_t)(uVar10 >> 8);
        write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\x13');
      }
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,uVar11);
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,
                        (uint8_t)uVar10);
      uVar9 = (vm->compiler).scope_depth;
      puVar3 = &(vm->compiler).vars_in_scope;
      *puVar3 = *puVar3 - (vm->compiler).scope[uVar9].size;
      var_ht_free((vm->compiler).scope + uVar9);
      puVar3 = &(vm->compiler).scope_depth;
      *puVar3 = *puVar3 - 1;
      return;
    }
  }
  logic_or(vm);
  return;
}

Assistant:

static void expr(Vm *vm) {
    switch (vm->compiler.token.type) {
        case TOKEN_FUN:
            lambda(vm);
            break;
        case TOKEN_OPEN_BRACE:
            block_expr(vm);
            break;
        case TOKEN_IF:
            if_expr(vm);
            break;
        case TOKEN_IDENTIFIER:
            assignment(vm);
            break;
        default:
            logic_or(vm);
            break;
    }
}